

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

void helper_mtc0_errctl_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint uVar1;
  
  uVar1 = (uint)arg1 & 0x4000000;
  if (env->itc_tag == (MemoryRegion *)0x0) {
    uVar1 = 0;
  }
  env->CP0_ErrCtl = uVar1 | (uint)arg1 & 0x30000000;
  uVar1 = (uint)(uVar1 != 0) << 0x1b;
  if ((arg1 & 0x30000000) != 0) {
    uVar1 = 0;
  }
  env->hflags = uVar1 | env->hflags & 0xf7ffffff;
  return;
}

Assistant:

void helper_mtc0_errctl(CPUMIPSState *env, target_ulong arg1)
{
    int32_t wst = arg1 & (1 << CP0EC_WST);
    int32_t spr = arg1 & (1 << CP0EC_SPR);
    int32_t itc = env->itc_tag ? (arg1 & (1 << CP0EC_ITC)) : 0;

    env->CP0_ErrCtl = wst | spr | itc;

    if (itc && !wst && !spr) {
        env->hflags |= MIPS_HFLAG_ITC_CACHE;
    } else {
        env->hflags &= ~MIPS_HFLAG_ITC_CACHE;
    }
}